

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_decimal_result<char_*> __thiscall
fmt::v8::detail::format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  ulong uVar1;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar2;
  undefined8 unaff_RBX;
  char *pcVar3;
  detail *pdVar4;
  detail *pdVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  format_decimal_result<char_*> fVar10;
  detail *pdVar11;
  
  uVar2 = CONCAT44(in_register_00000014,size);
  auVar9._8_8_ = unaff_RBX;
  auVar9._0_8_ = in_RAX;
  count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar9);
  pdVar4 = this + in_ECX;
  pcVar3 = out;
  pdVar5 = pdVar4;
  uVar6 = uVar2;
  pdVar11 = pdVar4;
  if ((out < (char *)0x64) <= uVar2) {
    do {
      pdVar4 = pdVar5 + -2;
      auVar9 = __udivti3(pcVar3,uVar6,100,0);
      uVar2 = auVar9._8_8_;
      out = auVar9._0_8_;
      bVar7 = (char *)0x270f < pcVar3;
      bVar8 = uVar6 != 0;
      uVar1 = -uVar6;
      *(undefined2 *)(pdVar5 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (long)(pcVar3 + (long)out * -100) * 2);
      pcVar3 = out;
      pdVar5 = pdVar4;
      uVar6 = uVar2;
    } while (bVar8 || uVar1 < bVar7);
  }
  if (uVar2 == 0 && (ulong)((char *)0x9 < out) <= -uVar2) {
    pdVar4[-1] = (detail)((byte)out | 0x30);
    pdVar4 = pdVar4 + -1;
  }
  else {
    *(undefined2 *)(pdVar4 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (long)out * 2);
    pdVar4 = pdVar4 + -2;
  }
  fVar10.end = (char *)pdVar11;
  fVar10.begin = (char *)pdVar4;
  return fVar10;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}